

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

void glfwInitHint(int hint,int value)

{
  if (hint == 0x52001) {
    _glfwInitHints.x11.xcbVulkanSurface = value;
    return;
  }
  if (hint == 0x50002) {
    _glfwInitHints.angleType = value;
    return;
  }
  if (hint == 0x51001) {
    _glfwInitHints.ns.chdir = value;
    return;
  }
  if (hint != 0x51002) {
    if (hint == 0x50001) {
      _glfwInitHints.hatButtons = value;
      return;
    }
    _glfwInputError(0x10003,"Invalid init hint 0x%08X");
    return;
  }
  _glfwInitHints.ns.menubar = value;
  return;
}

Assistant:

GLFWAPI void glfwInitHint(int hint, int value)
{
    switch (hint)
    {
        case GLFW_JOYSTICK_HAT_BUTTONS:
            _glfwInitHints.hatButtons = value;
            return;
        case GLFW_ANGLE_PLATFORM_TYPE:
            _glfwInitHints.angleType = value;
            return;
        case GLFW_COCOA_CHDIR_RESOURCES:
            _glfwInitHints.ns.chdir = value;
            return;
        case GLFW_COCOA_MENUBAR:
            _glfwInitHints.ns.menubar = value;
            return;
        case GLFW_X11_XCB_VULKAN_SURFACE:
            _glfwInitHints.x11.xcbVulkanSurface = value;
            return;
    }

    _glfwInputError(GLFW_INVALID_ENUM,
                    "Invalid init hint 0x%08X", hint);
}